

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.hpp
# Opt level: O0

uint64_t protozero::decode_varint(char **data,char *end)

{
  uint64_t val;
  char *end_local;
  char **data_local;
  
  if ((end == *data) || (((long)**data & 0x80U) != 0)) {
    data_local = (char **)detail::decode_varint_impl(data,end);
  }
  else {
    data_local = (char **)(long)**data;
    *data = *data + 1;
  }
  return (uint64_t)data_local;
}

Assistant:

inline uint64_t decode_varint(const char** data, const char* end) {
    // If this is a one-byte varint, decode it here.
    if (end != *data && ((static_cast<uint64_t>(**data) & 0x80U) == 0)) {
        const auto val = static_cast<uint64_t>(**data);
        ++(*data);
        return val;
    }
    // If this varint is more than one byte, defer to complete implementation.
    return detail::decode_varint_impl(data, end);
}